

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_LambdaResultCallWorks_Test::TestBody
          (SemanticAnalyserTest_LambdaResultCallWorks_Test *this)

{
  char *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string source;
  string *in_stack_000002f0;
  allocator<char> local_29;
  string local_28 [24];
  allocator<char> *in_stack_fffffffffffffff0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(unaff_retaddr,in_RDI,in_stack_fffffffffffffff0)
  ;
  std::allocator<char>::~allocator(&local_29);
  nothrowTest(in_stack_000002f0);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, LambdaResultCallWorks)
{
  std::string source = R"SRC(  
  fn main(): f32
  {
    (\(x: f32): function = { ret \(m: f32): f32 = { ret 2; }; })(1)(2);
    ret 0;
  }
  )SRC";
  nothrowTest(source);
}